

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::NotifyResized(App *this)

{
  resized = false;
  resize_term(0,0);
  Window::InvalidateScreen();
  if ((this->resizeHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(&this->resizeHandler);
  }
  OnResized(this);
  return;
}

Assistant:

void App::NotifyResized() {
    resized = false;
    resize_term(0, 0);
    Window::InvalidateScreen();
    if (this->resizeHandler) {
        this->resizeHandler();
    }
    this->OnResized();
}